

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag_default_read_test.cpp
# Opt level: O2

void __thiscall flag_read::test_method(flag_read *this)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  argument_order aVar1;
  tuple<> *arguments;
  undefined8 uVar2;
  long lVar3;
  initializer_list<char> __l;
  initializer_list<char> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  char local_7ba [2];
  function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  r;
  allocator local_78f;
  allocator local_78e;
  allocator local_78d;
  allocator local_78c;
  allocator local_78b;
  allocator local_78a;
  allocator_type local_789 [13];
  undefined4 local_77c;
  undefined1 local_778 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  tuple<> local_737;
  tuple<> local_736 [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>
  f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>
  local_628;
  tuple<> local_580;
  tuple<> local_57f [7];
  type opts;
  string local_558 [16];
  string local_548 [32];
  string local_528 [32];
  element_type *local_508;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_500;
  _Any_data local_4f8;
  _Manager_type local_4e8;
  _Invoker_type local_4e0;
  bool local_4d8;
  allocator_type local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  type local_2a8;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>,_std::tuple<>,_std::tuple<>_>
  cmd;
  
  std::__cxx11::string::string((string *)&local_730,"flag_read",&local_78a);
  std::__cxx11::string::string((string *)&local_3a8,"",&local_78b);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
                   *)local_778,&local_730,&local_3a8);
  local_7ba[1] = 0x61;
  std::__cxx11::string::string(local_3c8,"N",&local_78c);
  std::__cxx11::string::string(local_3e8,"",&local_78d);
  r.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  r.super__Function_base._M_functor._8_8_ = 0;
  r._M_invoker = std::
                 _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp:33:20)>
                 ::_M_invoke;
  r.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp:33:20)>
       ::_M_manager;
  __l._M_len = 1;
  __l._M_array = local_7ba + 1;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&opts,__l,(allocator_type *)&f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&opts.super_option_pair<char,__B_,_int>.value.
               super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )ZEXT816(0),local_428);
  std::__cxx11::string::string(local_548,local_3c8);
  std::__cxx11::string::string(local_528,local_3e8);
  local_4f8._M_unused._M_object = (void *)0x0;
  local_4f8._8_8_ = 0;
  local_508 = (element_type *)0x0;
  _Stack_500._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4e8 = (_Manager_type)0x0;
  local_4e0 = r._M_invoker;
  if (r.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_4f8._M_unused._M_object = r.super__Function_base._M_functor._M_unused._M_object;
    local_4f8._8_8_ = r.super__Function_base._M_functor._8_8_;
    local_4e8 = r.super__Function_base._M_manager;
    r.super__Function_base._M_manager = (_Manager_type)0x0;
    r._M_invoker = (_Invoker_type)0x0;
  }
  local_4d8 = false;
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_int>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>
          *)&f,(flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>
                *)&opts);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_int>_>,_std::tuple<>,_std::tuple<>_>
  ::basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>_>,_std::tuple<>,_std::tuple<>_>
                   *)&args_2,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778,
                  &local_758,
                  (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>_>
                   *)&f,&local_737,local_736);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_int>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>
           *)&f);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_int>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>
           *)&opts);
  std::_Function_base::~_Function_base(&r.super__Function_base);
  local_7ba[0] = 'b';
  std::__cxx11::string::string((string *)local_428,"N",&local_78e);
  std::__cxx11::string::string(local_408,"",&local_78f);
  local_77c = 0x32;
  r.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  r.super__Function_base._M_functor._8_8_ = 0;
  r._M_invoker = std::
                 _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp:33:20)>
                 ::_M_invoke;
  r.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp:33:20)>
       ::_M_manager;
  __l_00._M_len = 1;
  __l_00._M_array = local_7ba;
  std::vector<char,_std::allocator<char>_>::vector(&f.short_names,__l_00,(allocator_type *)&opts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&f.long_names,
           (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )ZEXT816(0),local_789);
  std::__cxx11::string::string((string *)&f.placeholder,(string *)local_428);
  std::__cxx11::string::string((string *)&f.help,local_408);
  std::make_shared<int,int_const&>((int *)&f.default_value);
  f.read.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  f.read.super__Function_base._M_functor._8_8_ = 0;
  f.read.super__Function_base._M_manager = (_Manager_type)0x0;
  f.read._M_invoker = r._M_invoker;
  if (r.super__Function_base._M_manager != (_Manager_type)0x0) {
    f.read.super__Function_base._M_functor._M_unused._M_object =
         r.super__Function_base._M_functor._M_unused._M_object;
    f.read.super__Function_base._M_functor._8_8_ = r.super__Function_base._M_functor._8_8_;
    f.read.super__Function_base._M_manager = r.super__Function_base._M_manager;
    r.super__Function_base._M_manager = (_Manager_type)0x0;
    r._M_invoker = (_Invoker_type)0x0;
  }
  f.exclusive = false;
  std::
  _Tuple_impl<0ul,nonsugar::detail::flag<std::__cxx11::string,char,(char)65,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)66,int>>
  ::
  _Tuple_impl<nonsugar::detail::flag<std::__cxx11::string,char,(char)65,int>const&,nonsugar::detail::flag<std::__cxx11::string,char,(char)66,int>,void>
            ((_Tuple_impl<0ul,nonsugar::detail::flag<std::__cxx11::string,char,(char)65,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)66,int>>
              *)&opts,&local_628,&f);
  arguments = local_57f;
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'B',_int>_>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&cmd,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_2,
                  &local_648,
                  (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>
                   *)&opts,&local_580,arguments);
  aVar1 = (argument_order)arguments;
  std::
  _Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'B',_int>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>
                  *)&opts);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'B',_int>
  ::~flag(&f);
  std::_Function_base::~_Function_base(&r.super__Function_base);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string((string *)local_428);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_int>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>_>,_std::tuple<>,_std::tuple<>_>
                    *)&args_2);
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::string::~string(local_3c8);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
                    *)local_778);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::string((string *)&opts,"-a33",(allocator *)&args_2);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&opts;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&f,__l_01,(allocator_type *)local_778);
  std::__cxx11::string::~string((string *)&opts);
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)65,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)66,int>>,std::tuple<>,std::tuple<>>>
            (&opts,(nonsugar *)
                   f.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )f.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&cmd.m_header,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>,_std::tuple<>,_std::tuple<>_>
              *)0x0,aVar1);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x31);
  if (opts.super_option_pair<char,__A_,_int>.value.
      super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    local_730._M_dataplus._M_p._0_1_ = false;
  }
  else {
    local_730._M_dataplus._M_p._0_1_ =
         *opts.super_option_pair<char,__A_,_int>.value.
          super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == 0x21;
  }
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)local_778,(value_expr<bool> *)&local_730,false);
  r.super__Function_base._M_functor._M_unused._M_object = anon_var_dwarf_1e930;
  r.super__Function_base._M_functor._8_8_ =
       (long)"(opts.has<\'A\'>() && opts.get<\'A\'>() == 33)" + 0x2a;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00140d28;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
  ;
  local_1f0 = "";
  boost::test_tools::tt_detail::report_assertion(local_778,&args_2,&local_1f8,0x31,1,0xe,0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_778 + 0x10));
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x32);
  if (opts.super_option_pair<char,__B_,_int>.value.
      super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    local_730._M_dataplus._M_p._0_1_ = false;
  }
  else {
    local_730._M_dataplus._M_p._0_1_ =
         *opts.super_option_pair<char,__B_,_int>.value.
          super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == 0x32;
  }
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)local_778,(value_expr<bool> *)&local_730,false);
  r.super__Function_base._M_functor._M_unused._M_object = anon_var_dwarf_1e93b;
  r.super__Function_base._M_functor._8_8_ =
       (long)"(opts.has<\'B\'>() && opts.get<\'B\'>() == 50)" + 0x2a;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00140d28;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
  ;
  local_220 = "";
  uVar2 = 0xe;
  boost::test_tools::tt_detail::report_assertion(local_778,&args_2,&local_228,0x32,1,0xe,0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_778 + 0x10));
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'A',_int>,_nonsugar::detail::option_pair<char,_'B',_int>_>
  ::~option_map(&opts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&f);
  std::__cxx11::string::string((string *)&opts,"-a33",(allocator *)&args_2);
  std::__cxx11::string::string(local_558,"-b66",(allocator *)local_778);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&opts;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&f,__l_02,(allocator_type *)&r);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string(local_558 + lVar3 + -0x20);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)65,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)66,int>>,std::tuple<>,std::tuple<>>>
            (&opts,(nonsugar *)
                   f.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )f.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&cmd.m_header,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>,_std::tuple<>,_std::tuple<>_>
              *)0x0,(argument_order)uVar2);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x37);
  if (opts.super_option_pair<char,__A_,_int>.value.
      super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    local_730._M_dataplus._M_p._0_1_ = false;
  }
  else {
    local_730._M_dataplus._M_p._0_1_ =
         *opts.super_option_pair<char,__A_,_int>.value.
          super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == 0x21;
  }
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)local_778,(value_expr<bool> *)&local_730,false);
  r.super__Function_base._M_functor._M_unused._M_object = anon_var_dwarf_1e930;
  r.super__Function_base._M_functor._8_8_ =
       (long)"(opts.has<\'A\'>() && opts.get<\'A\'>() == 33)" + 0x2a;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00140d28;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
  ;
  local_250 = "";
  boost::test_tools::tt_detail::report_assertion(local_778,&args_2,&local_258,0x37,1,0xe,0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_778 + 0x10));
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_268,0x38);
  if (opts.super_option_pair<char,__B_,_int>.value.
      super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    local_730._M_dataplus._M_p._0_1_ = false;
  }
  else {
    local_730._M_dataplus._M_p._0_1_ =
         *opts.super_option_pair<char,__B_,_int>.value.
          super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == 0x42;
  }
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)local_778,(value_expr<bool> *)&local_730,false);
  r.super__Function_base._M_functor._M_unused._M_object = anon_var_dwarf_1e951;
  r.super__Function_base._M_functor._8_8_ =
       (long)"(opts.has<\'B\'>() && opts.get<\'B\'>() == 66)" + 0x2a;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00140d28;
  args_2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
  ;
  local_280 = "";
  aVar1 = 0xe;
  boost::test_tools::tt_detail::report_assertion(local_778,&args_2,&local_288,0x38,1,0xe,0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_778 + 0x10));
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'A',_int>,_nonsugar::detail::option_pair<char,_'B',_int>_>
  ::~option_map(&opts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&f);
  std::__cxx11::string::string((string *)&opts,"-a120",(allocator *)&f);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&opts;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&args_2,__l_03,(allocator_type *)local_778);
  std::__cxx11::string::~string((string *)&opts);
  begin._M_current._1_7_ =
       args_2.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._1_7_;
  begin._M_current._0_1_ =
       args_2.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_1_;
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)65,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)66,int>>,std::tuple<>,std::tuple<>>>
            (&local_2a8,
             (nonsugar *)
             args_2.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,begin,&cmd.m_header,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>,_std::tuple<>,_std::tuple<>_>
              *)0x0,aVar1);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'A',_int>,_nonsugar::detail::option_pair<char,_'B',_int>_>
  ::~option_map(&local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args_2);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_368,0x49);
  local_778[0] = false;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&args_2,(value_expr<bool> *)local_778,false);
  f.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = "false";
  f.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = "";
  opts.super_option_pair<char,__A_,_int>.value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = 0;
  opts.super_option_pair<char,__A_,_int>.value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR__lazy_ostream_00140d28;
  opts.super_option_pair<char,__B_,_int>.value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
  ;
  local_380 = "";
  opts.super_option_pair<char,__B_,_int>.value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&f;
  boost::test_tools::tt_detail::report_assertion(&args_2,&opts,&local_388,0x49,1,0xe,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &args_2.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'B',_int>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&cmd);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(flag_read)
{
    auto const f = [](std::string const &str) -> std::shared_ptr<int>
        {
            try {
                auto const n = std::stoi(str);
                return n <= 100 ? std::make_shared<int>(n) : nullptr;
            } catch (...) {
                return nullptr;
            }
        };
    auto const cmd = command<char>("flag_read", "")
        .flag<'A', int>({'a'}, {}, "N", "", f)
        .flag<'B', int>({'b'}, {}, "N", "", 50, f)
        ;
    {
        std::vector<std::string> const args = { "-a33" };
        auto const opts = parse(args.begin(), args.end(), cmd);
        BOOST_TEST((opts.has<'A'>() && opts.get<'A'>() == 33));
        BOOST_TEST((opts.has<'B'>() && opts.get<'B'>() == 50));
    }
    {
        std::vector<std::string> const args = { "-a33", "-b66" };
        auto const opts = parse(args.begin(), args.end(), cmd);
        BOOST_TEST((opts.has<'A'>() && opts.get<'A'>() == 33));
        BOOST_TEST((opts.has<'B'>() && opts.get<'B'>() == 66));
    }
    try {
        std::vector<std::string> const args = { "-a120" };
        parse(args.begin(), args.end(), cmd);
    } catch (error const &e) {
        BOOST_TEST(e.message() == "flag_read: invalid argument: -a 120");
        try {
            std::vector<std::string> const args = { "-a33", "-b120" };
            parse(args.begin(), args.end(), cmd);
        } catch (error const &er) {
            BOOST_TEST(er.message() == "flag_read: invalid argument: -b 120");
            return;
        }
        BOOST_TEST(false);
        return;
    }
    BOOST_TEST(false);
}